

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.cpp
# Opt level: O1

void __thiscall FlatZinc::FlatZincSpace::newIntVar(FlatZincSpace *this,IntVarSpec *vs,string *name)

{
  SetLit *pSVar1;
  pointer pcVar2;
  _Bit_type *p_Var3;
  int *piVar4;
  bool bVar5;
  int *piVar6;
  IntVarSL *this_00;
  IntVar **ppIVar7;
  long lVar8;
  uint uVar10;
  int iVar11;
  byte bVar12;
  byte bVar13;
  ulong uVar14;
  size_type __new_size;
  int *i;
  int *elem;
  vec<int> d;
  vec<int> local_68;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  ulong uVar9;
  
  uVar10 = this->intVarCount;
  if (uVar10 == (this->iv).sz) {
    __new_size = 1;
    if (0 < (int)uVar10) {
      __new_size = (size_type)(uVar10 * 2);
    }
    vec<IntVar_*>::growTo(&this->iv,(uint)__new_size);
    std::vector<bool,_std::allocator<bool>_>::resize(&this->iv_introduced,__new_size,false);
  }
  if (so.use_var_is_introduced == true) {
    bVar12 = (vs->super_VarSpec).introduced;
  }
  else {
    bVar12 = (vs->super_VarSpec).output ^ 1;
  }
  bVar13 = bVar12;
  if ((so.introduced_heuristic == true) &&
     (bVar13 = 1, (vs->super_VarSpec).looks_introduced == false)) {
    bVar13 = bVar12;
  }
  if ((vs->super_VarSpec).alias == true) {
    ppIVar7 = (this->iv).data;
    this_00 = (IntVarSL *)ppIVar7[(uint)(vs->super_VarSpec).i];
    uVar10 = this->intVarCount;
    this->intVarCount = uVar10 + 1;
  }
  else {
    if ((vs->super_VarSpec).assigned == true) {
      this_00 = (IntVarSL *)getConstant(0);
    }
    else if ((vs->domain)._some == true) {
      pSVar1 = (vs->domain)._v;
      if (pSVar1->interval == true) {
        this_00 = (IntVarSL *)::newIntVar(pSVar1->min,pSVar1->max);
        pcVar2 = (name->_M_dataplus)._M_p;
        local_58 = (undefined1  [8])this_00;
        local_50._M_p = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
        std::
        _Rb_tree<IntVar*,std::pair<IntVar*const,std::__cxx11::string>,std::_Select1st<std::pair<IntVar*const,std::__cxx11::string>>,std::less<IntVar*>,std::allocator<std::pair<IntVar*const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<IntVar*,std::__cxx11::string>>
                  ((_Rb_tree<IntVar*,std::pair<IntVar*const,std::__cxx11::string>,std::_Select1st<std::pair<IntVar*const,std::__cxx11::string>>,std::less<IntVar*>,std::allocator<std::pair<IntVar*const,std::__cxx11::string>>>
                    *)&intVarString_abi_cxx11_,
                   (pair<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_58);
        if (local_50._M_p != local_40) {
          operator_delete(local_50._M_p);
        }
      }
      else {
        local_68.sz = 0;
        local_68.cap = 0;
        local_68.data = (int *)0x0;
        piVar4 = (pSVar1->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar6 = local_68.data;
        for (elem = (pSVar1->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; local_68.data = piVar6, elem != piVar4;
            elem = elem + 1) {
          vec<int>::push(&local_68,elem);
          piVar6 = local_68.data;
        }
        uVar14 = local_68._0_8_ & 0xffffffff;
        if (uVar14 != 0) {
          lVar8 = 0x3f;
          if (uVar14 != 0) {
            for (; local_68.sz >> lVar8 == 0; lVar8 = lVar8 + -1) {
            }
          }
          std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar6,piVar6 + uVar14,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
          std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar6,piVar6 + uVar14);
        }
        this_00 = (IntVarSL *)::newIntVar(*local_68.data,local_68.data[local_68.sz - 1]);
        pcVar2 = (name->_M_dataplus)._M_p;
        local_58 = (undefined1  [8])this_00;
        local_50._M_p = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
        std::
        _Rb_tree<IntVar*,std::pair<IntVar*const,std::__cxx11::string>,std::_Select1st<std::pair<IntVar*const,std::__cxx11::string>>,std::less<IntVar*>,std::allocator<std::pair<IntVar*const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<IntVar*,std::__cxx11::string>>
                  ((_Rb_tree<IntVar*,std::pair<IntVar*const,std::__cxx11::string>,std::_Select1st<std::pair<IntVar*const,std::__cxx11::string>>,std::less<IntVar*>,std::allocator<std::pair<IntVar*const,std::__cxx11::string>>>
                    *)&intVarString_abi_cxx11_,
                   (pair<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_58);
        if (local_50._M_p != local_40) {
          operator_delete(local_50._M_p);
        }
        iVar11 = -1;
        uVar10 = local_68.sz;
        if (local_68.sz != 0) {
          do {
            iVar11 = iVar11 + 1;
            bVar5 = 1 < uVar10;
            uVar10 = (int)uVar10 >> 1;
          } while (bVar5);
        }
        if ((local_68.data[local_68.sz - 1] - *local_68.data < (int)(iVar11 * local_68.sz)) &&
           ((so.eager_limit < (int)local_68.sz ||
            (local_68.data[local_68.sz - 1] - *local_68.data < so.eager_limit)))) {
          iVar11 = (*(this_00->super_IntVar).super_Var.super_Branching._vptr_Branching[0x12])
                             (this_00,&local_68,0,1);
          if ((char)iVar11 == '\0') {
            puts("=====UNSATISFIABLE=====");
            printf("%% Top level failure!\n");
            exit(0);
          }
        }
        else {
          IntVarSL::IntVarSL(this_00,(IntVar *)this_00,&local_68);
        }
        if (local_68.data != (int *)0x0) {
          free(local_68.data);
        }
      }
    }
    else {
      this_00 = (IntVarSL *)::newIntVar(-500000000,500000000);
    }
    if ((so.exclude_introduced == true) && (bVar13 != 0)) {
      (this_00->super_IntVar).should_be_learnable = false;
    }
    if ((so.decide_introduced == false) && (bVar13 != 0)) {
      (this_00->super_IntVar).should_be_decidable = false;
    }
    uVar10 = this->intVarCount;
    this->intVarCount = uVar10 + 1;
    ppIVar7 = (this->iv).data;
  }
  ppIVar7[uVar10] = &this_00->super_IntVar;
  uVar14 = (long)this->intVarCount - 1;
  uVar9 = (long)this->intVarCount + 0x3e;
  if (-1 < (long)uVar14) {
    uVar9 = uVar14;
  }
  lVar8 = (long)uVar9 >> 6;
  p_Var3 = (this->iv_introduced).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar9 = (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001);
  uVar14 = 1L << ((byte)uVar14 & 0x3f);
  if (bVar13 == 0) {
    uVar14 = ~uVar14 & p_Var3[lVar8 + uVar9 + 0xffffffffffffffff];
  }
  else {
    uVar14 = uVar14 | p_Var3[lVar8 + uVar9 + 0xffffffffffffffff];
  }
  p_Var3[lVar8 + uVar9 + 0xffffffffffffffff] = uVar14;
  return;
}

Assistant:

void FlatZincSpace::newIntVar(IntVarSpec* vs, const std::string& name) {
	// Resizing of the vectors if required
	if (intVarCount == static_cast<int>(iv.size())) {
		const int newSize = intVarCount > 0 ? 2 * intVarCount : 1;
		iv.growTo(newSize);
		iv_introduced.resize(newSize);
	}
	bool considerIntroduced = false;
	if (so.use_var_is_introduced) {
		considerIntroduced = vs->introduced;
	} else {
		considerIntroduced = !vs->output;
	}
	if (so.introduced_heuristic && vs->looks_introduced) {
		considerIntroduced = true;
	}
	if (vs->alias) {
		iv[intVarCount++] = iv[vs->i];
	} else {
		IntVar* v = nullptr;
		if (vs->assigned) {
			v = getConstant(vs->i);
		} else if (vs->domain()) {
			AST::SetLit* sl = vs->domain.some();
			if (sl->interval) {
				v = ::newIntVar(sl->min, sl->max);
				intVarString.insert(std::pair<IntVar*, std::string>(v, name));
			} else {
				vec<int> d;
				for (const int& i : sl->s) {
					d.push(i);
				}
				std::sort((int*)d, (int*)d + d.size());
				v = ::newIntVar(d[0], d.last());
				intVarString.insert(std::pair<IntVar*, std::string>(v, name));
				if ((d.last() - d[0] >= static_cast<int>(d.size() * mylog2(d.size()))) ||
						(static_cast<int>(d.size()) <= so.eager_limit &&
						 (d.last() - d[0] + 1) > so.eager_limit)) {
					new (v) IntVarSL(*v, d);
				} else {
					if (!v->allowSet(d)) {
						TL_FAIL();
					}
				}
			}
		} else {
			v = ::newIntVar();
		}
		/* std::cerr << "int var: " << intVarCount << " " << v << "\n"; */

		if (so.exclude_introduced && considerIntroduced) {
			v->should_be_learnable = false;
		}
		if (!so.decide_introduced && considerIntroduced) {
			v->should_be_decidable = false;
		}
		iv[intVarCount++] = v;
	}
	iv_introduced[intVarCount - 1] = considerIntroduced;
}